

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_context.cpp
# Opt level: O2

void __thiscall
TransactionContext_TapScriptSign_Test::TestBody(TransactionContext_TapScriptSign_Test *this)

{
  ByteData256 *node;
  long lVar1;
  pointer commitment;
  char *pcVar2;
  char *in_R9;
  initializer_list<cfd::core::ByteData256> __l;
  initializer_list<cfd::SignParameter> __l_00;
  initializer_list<cfd::UtxoData> __l_01;
  bool is_parity;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_1228;
  allocator_type local_1210 [12];
  SigHashType sighash_all;
  SchnorrPubkey schnorr_pubkey;
  Amount amt1;
  ScriptBuilder builder;
  TransactionContext invalid_sign_tx;
  ByteData256 sighash;
  ByteData256 tap_leaf_hash;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  SignParameter sign_param;
  Pubkey pubkey;
  SigHashType local_101c;
  Privkey key1;
  Privkey key;
  SchnorrSignature sig;
  OutPoint outpoint2;
  OutPoint outpoint1;
  AddressFactory addr_factory;
  AssertionResult gtest_ar;
  TransactionContext tx2;
  Script redeem_script;
  Address txout1_addr;
  UtxoData utxo;
  TransactionContext tx1;
  Address addr2;
  TaprootScriptTree tree;
  
  std::__cxx11::string::string
            ((string *)&utxo,"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
             (allocator *)&gtest_ar);
  cfd::core::Privkey::Privkey(&key,(string *)&utxo,kMainnet,true);
  std::__cxx11::string::~string((string *)&utxo);
  cfd::core::Privkey::GeneratePubkey(&pubkey,&key,true);
  is_parity = false;
  cfd::core::SchnorrPubkey::FromPubkey(&schnorr_pubkey,&pubkey,&is_parity);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_((string *)&utxo,&schnorr_pubkey);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"",
             "schnorr_pubkey.GetHex()",(char (*) [65])0x43ec30,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&utxo);
  std::__cxx11::string::~string((string *)&utxo);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&utxo);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&txout1_addr,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x355,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&txout1_addr,(Message *)&utxo);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&txout1_addr);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&utxo);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.success_ = is_parity;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (is_parity == false) {
    testing::Message::Message((Message *)&txout1_addr);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&utxo,(internal *)&gtest_ar,(AssertionResult *)"is_parity","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addr2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x356,(char *)utxo.block_height);
    testing::internal::AssertHelper::operator=((AssertHelper *)&addr2,(Message *)&txout1_addr);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addr2);
    std::__cxx11::string::~string((string *)&utxo);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&txout1_addr);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  builder._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_00647848;
  builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::SchnorrPubkey::GetData((ByteData *)&utxo,&schnorr_pubkey);
  cfd::core::ScriptBuilder::AppendData(&builder,(ByteData *)&utxo);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&utxo);
  cfd::core::ScriptBuilder::AppendOperator
            (&builder,(ScriptOperator *)cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build(&redeem_script,&builder);
  std::__cxx11::string::string
            ((string *)&gtest_ar,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
             (allocator *)&addr2);
  cfd::core::ByteData256::ByteData256((ByteData256 *)&utxo,(string *)&gtest_ar);
  std::__cxx11::string::string
            ((string *)&txout1_addr,
             "dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",(allocator *)&tx1);
  cfd::core::ByteData256::ByteData256
            ((ByteData256 *)
             ((long)&utxo.block_hash.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 8),(string *)&txout1_addr);
  __l._M_len = 2;
  __l._M_array = (iterator)&utxo;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            (&nodes,__l,(allocator_type *)&tx2);
  lVar1 = 0x18;
  do {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&utxo.block_height + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  std::__cxx11::string::~string((string *)&txout1_addr);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::TaprootScriptTree::TaprootScriptTree(&tree,&redeem_script);
  for (commitment = nodes.
                    super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      commitment !=
      nodes.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
      _M_impl.super__Vector_impl_data._M_finish; commitment = commitment + 1) {
    cfd::core::TaprootScriptTree::AddBranch(&tree,commitment);
  }
  cfd::core::TaprootScriptTree::GetTapLeafHash((ByteData256 *)&gtest_ar,&tree);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&utxo,(ByteData256 *)&gtest_ar);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&txout1_addr,
             "\"dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513\"",
             "tree.GetTapLeafHash().GetHex()",
             (char (*) [65])"dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&utxo);
  std::__cxx11::string::~string((string *)&utxo);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  if ((undefined1)txout1_addr.type_ == kCfdSuccess) {
    testing::Message::Message((Message *)&utxo);
    if (txout1_addr._8_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)txout1_addr._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x362,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&utxo);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&utxo);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&txout1_addr.witness_ver_);
  cfd::AddressFactory::AddressFactory(&addr_factory,kRegtest);
  cfd::AddressFactory::CreateTaprootAddress(&txout1_addr,&addr_factory,&tree,&schnorr_pubkey);
  cfd::TransactionContext::TransactionContext(&tx1,2,0);
  std::__cxx11::string::string
            ((string *)&gtest_ar,"cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd",
             (allocator *)&addr2);
  cfd::core::Txid::Txid((Txid *)&utxo,(string *)&gtest_ar);
  cfd::core::OutPoint::OutPoint(&outpoint1,(Txid *)&utxo,0);
  cfd::core::Txid::~Txid((Txid *)&utxo);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string
            ((string *)&utxo,"cNveTchXQTFjtsMmR7B7MZmebXnU69S7PmDfgrUX6KbT9kyDLH57",
             (allocator *)&gtest_ar);
  cfd::core::Privkey::FromWif(&key1,(string *)&utxo,kCustomChain,true);
  std::__cxx11::string::~string((string *)&utxo);
  cfd::TransactionContext::AddTxIn(&tx1,&outpoint1);
  cfd::core::Amount::Amount(&amt1,0x9502f518);
  cfd::TransactionContext::AddTxOut(&tx1,&txout1_addr,&amt1);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_((string *)&utxo,(AbstractTransaction *)&tx1);
  testing::internal::CmpHelperEQ<char[189],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"0200000001dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d200000000\""
             ,"tx1.GetHex()",
             (char (*) [189])
             "0200000001dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d200000000"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&utxo);
  std::__cxx11::string::~string((string *)&utxo);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&utxo);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addr2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x36f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&addr2,(Message *)&utxo);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addr2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&utxo);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::SigHashType::SigHashType(&sighash_all);
  cfd::core::Privkey::GetPubkey((Pubkey *)&utxo,&key1);
  cfd::core::SigHashType::SigHashType(&local_101c,&sighash_all);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,2500000000);
  cfd::TransactionContext::SignWithPrivkeySimple
            (&tx1,&outpoint1,(Pubkey *)&utxo,&key1,&local_101c,(Amount *)&gtest_ar,kP2wpkhAddress,
             true);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&utxo);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_((string *)&utxo,(AbstractTransaction *)&tx1);
  testing::internal::CmpHelperEQ<char[407],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"02000000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d20247304402201db912bc61dab1c6117b0aec2965ea1b2d1caa42a1372adc16c8cf673f1187d7022062667d8a976b197f7ba33299365eeb68c1e45fa2a255411672d89f7afab12cb20121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000\""
             ,"tx1.GetHex()",
             (char (*) [407])
             "02000000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d20247304402201db912bc61dab1c6117b0aec2965ea1b2d1caa42a1372adc16c8cf673f1187d7022062667d8a976b197f7ba33299365eeb68c1e45fa2a255411672d89f7afab12cb20121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&utxo);
  std::__cxx11::string::~string((string *)&utxo);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&utxo);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&addr2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x373,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&addr2,(Message *)&utxo);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&addr2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&utxo);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::UtxoData::UtxoData(&utxo);
  utxo.block_height = 0;
  cfd::core::AbstractTransaction::GetTxid((Txid *)&gtest_ar,(AbstractTransaction *)&tx1);
  cfd::core::Txid::operator=(&utxo.txid,(Txid *)&gtest_ar);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar);
  utxo.vout = 0;
  cfd::core::Address::GetLockingScript((Script *)&gtest_ar,&txout1_addr);
  cfd::core::Script::operator=(&utxo.locking_script,(Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  cfd::core::Script::GetHex_abi_cxx11_((string *)&tx2,&utxo.locking_script);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr2,"raw(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tx2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&addr2,")");
  std::__cxx11::string::operator=((string *)&utxo.descriptor,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&addr2);
  std::__cxx11::string::~string((string *)&tx2);
  cfd::core::Address::operator=(&utxo.address,&txout1_addr);
  utxo.amount.ignore_check_ = amt1.ignore_check_;
  utxo.amount.amount_ = amt1.amount_;
  utxo.address_type = txout1_addr.addr_type_;
  utxo.binary_data = (void *)0x0;
  cfd::core::AbstractTransaction::GetTxid((Txid *)&gtest_ar,(AbstractTransaction *)&tx1);
  cfd::core::OutPoint::OutPoint(&outpoint2,(Txid *)&gtest_ar,0);
  cfd::core::Txid::~Txid((Txid *)&gtest_ar);
  cfd::TransactionContext::TransactionContext(&tx2,2,0);
  cfd::TransactionContext::AddInput(&tx2,&utxo);
  std::__cxx11::string::string
            ((string *)&gtest_ar,"bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40",
             (allocator *)&invalid_sign_tx);
  cfd::core::Address::Address(&addr2,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::core::Amount::Amount((Amount *)&gtest_ar,0x9502f130);
  cfd::TransactionContext::AddTxOut(&tx2,&addr2,(Amount *)&gtest_ar);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_((string *)&gtest_ar,(AbstractTransaction *)&tx2)
  ;
  testing::internal::CmpHelperEQ<char[165],std::__cxx11::string>
            ((internal *)&invalid_sign_tx,
             "\"02000000015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d500000000\""
             ,"tx2.GetHex()",
             (char (*) [165])
             "02000000015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d500000000"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if ((char)invalid_sign_tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction ==
      '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (invalid_sign_tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_ == (void *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *invalid_sign_tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sign_param,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x385,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sign_param,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sign_param);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&invalid_sign_tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_);
  cfd::core::TaprootScriptTree::GetTapLeafHash(&tap_leaf_hash,&tree);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar,&tap_leaf_hash);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&invalid_sign_tx,
             "\"dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513\"",
             "tap_leaf_hash.GetHex()",
             (char (*) [65])"dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if ((char)invalid_sign_tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction ==
      '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (invalid_sign_tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_ == (void *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *invalid_sign_tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sign_param,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x388,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sign_param,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sign_param);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&invalid_sign_tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_);
  cfd::TransactionContext::CreateSignatureHashByTaproot
            (&sighash,&tx2,&outpoint2,&sighash_all,&tap_leaf_hash,(uint32_t *)0x0,(ByteData *)0x0);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&gtest_ar,&sighash);
  testing::internal::CmpHelperEQ<char[65],std::__cxx11::string>
            ((internal *)&invalid_sign_tx,
             "\"80e53eaee13048aee9c6c13fa5a8529aad7fe2c362bfc16f1e2affc71f591d36\"",
             "sighash.GetHex()",
             (char (*) [65])"80e53eaee13048aee9c6c13fa5a8529aad7fe2c362bfc16f1e2affc71f591d36",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if ((char)invalid_sign_tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction ==
      '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (invalid_sign_tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_ == (void *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *invalid_sign_tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sign_param,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x38a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sign_param,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sign_param);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&invalid_sign_tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_);
  cfd::core::SchnorrUtil::Sign(&sig,&sighash,&key);
  cfd::core::SchnorrSignature::GetHex_abi_cxx11_((string *)&gtest_ar,&sig,false);
  testing::internal::CmpHelperEQ<char[129],std::__cxx11::string>
            ((internal *)&invalid_sign_tx,
             "\"f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee9\""
             ,"sig.GetHex()",
             (char (*) [129])
             "f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee9"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if ((char)invalid_sign_tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction ==
      '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (invalid_sign_tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_ == (void *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *invalid_sign_tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&sign_param,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x38d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&sign_param,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&sign_param);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&invalid_sign_tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_);
  cfd::core::SchnorrSignature::SetSigHashType(&sig,&sighash_all);
  cfd::core::SchnorrSignature::GetData((ByteData *)&gtest_ar,&sig,true);
  cfd::SignParameter::SignParameter(&sign_param,(ByteData *)&gtest_ar);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
  cfd::SignParameter::SignParameter((SignParameter *)&gtest_ar,&sign_param);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&gtest_ar;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)&invalid_sign_tx,
             __l_00,(allocator_type *)&local_1228);
  cfd::TransactionContext::AddTapScriptSign
            (&tx2,&outpoint2,&tree,&schnorr_pubkey,
             (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)&invalid_sign_tx,
             (ByteData *)0x0);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)&invalid_sign_tx);
  cfd::SignParameter::~SignParameter((SignParameter *)&gtest_ar);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_((string *)&gtest_ar,(AbstractTransaction *)&tx2)
  ;
  testing::internal::CmpHelperEQ<char[569],std::__cxx11::string>
            ((internal *)&invalid_sign_tx,
             "\"020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5400000000\""
             ,"tx2.GetHex()",
             (char (*) [569])
             "020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5400000000"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if ((char)invalid_sign_tx.super_Transaction.super_AbstractTransaction._vptr_AbstractTransaction ==
      '\0') {
    testing::Message::Message((Message *)&gtest_ar);
    if (invalid_sign_tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_ == (void *)0x0
       ) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *invalid_sign_tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x392,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1228,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1228);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&invalid_sign_tx.super_Transaction.super_AbstractTransaction.wally_tx_pointer_);
  cfd::TransactionContext::Verify(&tx2);
  std::__cxx11::string::string
            ((string *)&gtest_ar,
             "020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d3d5400000000"
             ,(allocator *)&local_1228);
  cfd::TransactionContext::TransactionContext(&invalid_sign_tx,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  cfd::UtxoData::UtxoData((UtxoData *)&gtest_ar,&utxo);
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&gtest_ar;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector(&local_1228,__l_01,local_1210);
  cfd::TransactionContext::CollectInputUtxo(&invalid_sign_tx,&local_1228);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_1228);
  cfd::UtxoData::~UtxoData((UtxoData *)&gtest_ar);
  cfd::TransactionContext::Verify(&invalid_sign_tx);
  cfd::TransactionContext::~TransactionContext(&invalid_sign_tx);
  cfd::SignParameter::~SignParameter(&sign_param);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tap_leaf_hash);
  cfd::core::Address::~Address(&addr2);
  cfd::TransactionContext::~TransactionContext(&tx2);
  cfd::core::Txid::~Txid(&outpoint2.txid_);
  cfd::UtxoData::~UtxoData(&utxo);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key1);
  cfd::core::Txid::~Txid(&outpoint1.txid_);
  cfd::TransactionContext::~TransactionContext(&tx1);
  cfd::core::Address::~Address(&txout1_addr);
  cfd::AddressFactory::~AddressFactory(&addr_factory);
  cfd::core::TaprootScriptTree::~TaprootScriptTree(&tree);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&nodes);
  cfd::core::Script::~Script(&redeem_script);
  cfd::core::ScriptBuilder::~ScriptBuilder(&builder);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  return;
}

Assistant:

TEST(TransactionContext, TapScriptSign)
{
  Privkey key("305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);

  ScriptBuilder builder;
  builder.AppendData(schnorr_pubkey.GetData());
  builder.AppendOperator(ScriptOperator::OP_CHECKSIG);
  Script redeem_script = builder.Build();
  std::vector<ByteData256> nodes = {
    ByteData256("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"),
    ByteData256("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54")
  };
  TaprootScriptTree tree(redeem_script);
  for (const auto& node : nodes) tree.AddBranch(node);
  EXPECT_EQ("dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513", tree.GetTapLeafHash().GetHex());

  AddressFactory addr_factory(NetType::kRegtest);
  auto txout1_addr = addr_factory.CreateTaprootAddress(tree, schnorr_pubkey);

  TransactionContext tx1(2, 0);
  OutPoint outpoint1(
    Txid("cd6adc252632eb0768ac6407e586cc74bfed739d6c8b9efa55305eb37cbd76dd"), 0);
  Privkey key1 = Privkey::FromWif("cNveTchXQTFjtsMmR7B7MZmebXnU69S7PmDfgrUX6KbT9kyDLH57");

  tx1.AddTxIn(outpoint1);
  Amount amt1(int64_t{2499999000});
  tx1.AddTxOut(txout1_addr, amt1);
  EXPECT_EQ("0200000001dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d200000000", tx1.GetHex());
  SigHashType sighash_all;
  tx1.SignWithPrivkeySimple(outpoint1, key1.GetPubkey(), key1, sighash_all,
      Amount(int64_t{2500000000}), AddressType::kP2wpkhAddress);
  EXPECT_EQ("02000000000101dd76bd7cb35e3055fa9e8b6c9d73edbf74cc86e50764ac6807eb322625dc6acd0000000000ffffffff0118f50295000000002251203dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d20247304402201db912bc61dab1c6117b0aec2965ea1b2d1caa42a1372adc16c8cf673f1187d7022062667d8a976b197f7ba33299365eeb68c1e45fa2a255411672d89f7afab12cb20121023179b32721d07deb06cade59f56dedefdc932e89fde56e998f7a0e93a3e30c4400000000", tx1.GetHex());
  
  UtxoData utxo;
  utxo.block_height = 0;
  utxo.txid = tx1.GetTxid();
  utxo.vout = 0;
  utxo.locking_script = txout1_addr.GetLockingScript();
  utxo.descriptor = "raw(" + utxo.locking_script.GetHex() + ")";
  utxo.address = txout1_addr;
  utxo.amount = amt1;
  utxo.address_type = txout1_addr.GetAddressType();
  utxo.binary_data = nullptr;

  OutPoint outpoint2(tx1.GetTxid(), 0);
  TransactionContext tx2(2, 0);
  tx2.AddInput(utxo);
  Address addr2("bcrt1qze8fshg0eykfy7nxcr96778xagufv2w429wx40");
  tx2.AddTxOut(addr2, Amount(int64_t{2499998000}));
  EXPECT_EQ("02000000015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d500000000", tx2.GetHex());
 
  ByteData256 tap_leaf_hash = tree.GetTapLeafHash();
  EXPECT_EQ("dfc43ba9fc5f8a9e1b6d6a50600c704bb9e41b741d9ed6de6559a53d2f38e513", tap_leaf_hash.GetHex());
  auto sighash = tx2.CreateSignatureHashByTaproot(outpoint2, sighash_all, &tap_leaf_hash);
  EXPECT_EQ("80e53eaee13048aee9c6c13fa5a8529aad7fe2c362bfc16f1e2affc71f591d36", sighash.GetHex());

  auto sig = SchnorrUtil::Sign(sighash, key);
  EXPECT_EQ("f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee9", sig.GetHex());
  sig.SetSigHashType(sighash_all);
  SignParameter sign_param(sig.GetData(true));
  tx2.AddTapScriptSign(outpoint2, tree, schnorr_pubkey, {sign_param});

  EXPECT_EQ("020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5400000000", tx2.GetHex());

  try {
    tx2.Verify();
  } catch (const CfdException& except) {
    EXPECT_STREQ("The script analysis of tapscript is not supported.", except.what());
  }

  TransactionContext invalid_sign_tx("020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d3d5400000000");
  invalid_sign_tx.CollectInputUtxo({utxo});
  try {
    invalid_sign_tx.Verify();
  } catch (const CfdException& except) {
    EXPECT_STREQ("Unmatch locking script.", except.what());
  }
}